

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

int vocisect(objnum *list1,objnum *list2)

{
  objnum oVar1;
  objnum oVar2;
  long lVar3;
  int iVar4;
  objnum *poVar5;
  
  lVar3 = 0;
  iVar4 = 0;
  do {
    oVar1 = list1[lVar3];
    poVar5 = list2;
    if (oVar1 == 0xffff) {
      list1[iVar4] = 0xffff;
      return iVar4;
    }
    do {
      oVar2 = *poVar5;
      if (oVar2 == 0xffff) goto LAB_001f8526;
      poVar5 = poVar5 + 1;
    } while (oVar1 != oVar2);
    list1[iVar4] = oVar1;
    iVar4 = iVar4 + 1;
LAB_001f8526:
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int vocisect(objnum *list1, objnum *list2)
{
    int i, j, k;

    for (i = k = 0 ; list1[i] != MCMONINV ; ++i)
    {
        for (j = 0 ; list2[j] != MCMONINV ; ++j)
        {
            if (list1[i] == list2[j])
            {
                list1[k++] = list1[i];
                break;
            }
        }
    }
    list1[k] = MCMONINV;
    return(k);
}